

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdminPanelView.cpp
# Opt level: O2

void __thiscall AdminPanelView::display(AdminPanelView *this)

{
  int iVar1;
  ostream *poVar2;
  Application *this_00;
  BaseUser *this_01;
  string sStack_38;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Admin: ");
  this_00 = Application::getInstance();
  this_01 = Application::getCurrentUser(this_00);
  BaseUser::getFullName_abi_cxx11_(&sStack_38,this_01);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&sStack_38);
  View::populateMenu(&this->super_View);
  iVar1 = Input::getInt();
  View::callView(&this->super_View,iVar1 + -1);
  return;
}

Assistant:

void AdminPanelView::display() {
    cout << "Admin: " << Application::getInstance().getCurrentUser()->getFullName() << endl;
    populateMenu();
    callView(Input::getInt() - 1);
}